

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_buildmap.cpp
# Opt level: O0

void __thiscall ACustomSprite::BeginPlay(ACustomSprite *this)

{
  double local_38;
  TFlags<ActorRenderFlag,_unsigned_int> local_28;
  uint local_24;
  int local_20;
  int cstat;
  char name [9];
  ACustomSprite *this_local;
  
  name._1_8_ = this;
  AActor::BeginPlay(&this->super_AActor);
  mysnprintf((char *)((long)&cstat + 3),9,"BTIL%04d");
  local_20 = (int)FTextureManager::GetTexture(&TexMan,(char *)((long)&cstat + 3),5,0);
  (this->super_AActor).picnum.texnum = local_20;
  (this->super_AActor).Scale.X = (double)(this->super_AActor).args[2] / 64.0;
  (this->super_AActor).Scale.Y = (double)(this->super_AActor).args[3] / 64.0;
  local_24 = (this->super_AActor).args[4];
  if ((local_24 & 2) != 0) {
    FRenderStyle::operator=
              ((FRenderStyle *)&(this->super_AActor).RenderStyle.field_0,STYLE_Translucent);
    local_38 = 0.6666;
    if ((local_24 & 0x200) == 0) {
      local_38 = 0.3333;
    }
    (this->super_AActor).Alpha = local_38;
  }
  if ((local_24 & 4) != 0) {
    TFlags<ActorRenderFlag,_unsigned_int>::operator|=(&(this->super_AActor).renderflags,RF_XFLIP);
  }
  if ((local_24 & 8) != 0) {
    TFlags<ActorRenderFlag,_unsigned_int>::operator|=(&(this->super_AActor).renderflags,RF_YFLIP);
  }
  TFlags<ActorRenderFlag,_unsigned_int>::FromInt(&local_28,((int)local_24 >> 4 & 3U) << 0xc);
  TFlags<ActorRenderFlag,_unsigned_int>::operator|=(&(this->super_AActor).renderflags,&local_28);
  return;
}

Assistant:

void ACustomSprite::BeginPlay ()
{
	char name[9];
	Super::BeginPlay ();

	mysnprintf (name, countof(name), "BTIL%04d", args[0] & 0xffff);
	picnum = TexMan.GetTexture (name, FTexture::TEX_Build);

	Scale.X = args[2] / 64.;
	Scale.Y = args[3] / 64.;

	int cstat = args[4];
	if (cstat & 2)
	{
		RenderStyle = STYLE_Translucent;
		Alpha = (cstat & 512) ? 0.6666 : 0.3333;
	}
	if (cstat & 4)
		renderflags |= RF_XFLIP;
	if (cstat & 8)
		renderflags |= RF_YFLIP;

	// set face/wall/floor flags
	renderflags |= ActorRenderFlags::FromInt (((cstat >> 4) & 3) << 12);
}